

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec10.c
# Opt level: O1

int If_Dec10Perform(word *pF,int nVars,int fDerive)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  byte bVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  word Mask;
  word *pwVar13;
  uint v;
  uint uVar14;
  uint v_00;
  int iVar15;
  uint uVar16;
  uint *puVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  word *pwVar21;
  uint *puVar22;
  uint uVar23;
  int Var2Pla [10];
  int Pla2Var [10];
  word pCof1 [16];
  word pCof0 [16];
  int Count [210];
  int Masks [210];
  uint local_8a8 [12];
  uint local_878 [12];
  ulong local_848 [16];
  ulong local_7c8 [16];
  ulong local_748 [16];
  uint local_6c8 [212];
  uint local_378 [210];
  
  if (4 < nVars - 6U) {
    __assert_fail("nVars >= 6 && nVars <= 10",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec10.c"
                  ,0x184,"int If_Dec10Perform(word *, int, int)");
  }
  if (0 < nVars) {
    uVar4 = 1 << ((byte)(nVars - 6U) & 0x1f);
    if (nVars < 7) {
      uVar4 = 1;
    }
    uVar5 = 0;
    do {
      if (5 < uVar5) {
        bVar9 = (byte)(uVar5 - 6);
        uVar19 = 1 << (bVar9 & 0x1f);
        iVar10 = 2 << (bVar9 & 0x1f);
        uVar20 = 1;
        if (1 < (int)uVar19) {
          uVar20 = (ulong)uVar19;
        }
        pwVar21 = pF + (int)uVar19;
        iVar15 = 0;
        pwVar13 = pF;
        do {
          if (uVar5 - 6 != 0x1f) {
            uVar6 = 0;
            do {
              if (pwVar13[uVar6] != pwVar21[uVar6]) goto LAB_00394097;
              uVar6 = uVar6 + 1;
            } while (uVar20 != uVar6);
          }
          iVar15 = iVar15 + iVar10;
          pwVar21 = pwVar21 + iVar10;
          pwVar13 = pwVar13 + iVar10;
        } while (iVar15 < (int)uVar4);
LAB_003945ad:
        __assert_fail("If_Dec10HasVar( pF, nVars, i )",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec10.c"
                      ,0x188,"int If_Dec10Perform(word *, int, int)");
      }
      uVar20 = 0;
      while ((pF[uVar20] & ~Truth6[uVar5]) ==
             (pF[uVar20] & Truth6[uVar5]) >> ((byte)(1 << ((byte)uVar5 & 0x1f)) & 0x3f)) {
        uVar20 = uVar20 + 1;
        if (uVar4 == uVar20) goto LAB_003945ad;
      }
LAB_00394097:
      local_8a8[uVar5] = (uint)uVar5;
      local_878[uVar5] = (uint)uVar5;
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uint)nVars);
  }
  if (nVars < 1) {
    uVar4 = 0;
  }
  else {
    bVar9 = (byte)(nVars + -4);
    uVar20 = ~(-1L << ((byte)(1 << (bVar9 & 0x1f)) & 0x3f));
    uVar5 = 0xffffffffffffffff;
    if (nVars != 10) {
      uVar5 = uVar20;
    }
    lVar11 = 0;
    uVar19 = 0;
    do {
      uVar2 = uVar19 + 1;
      if ((int)uVar2 < nVars) {
        uVar4 = uVar2;
        do {
          uVar16 = uVar4 + 1;
          if ((int)uVar16 < nVars) {
            v = uVar16;
            do {
              uVar14 = v + 1;
              if ((int)uVar14 < nVars) {
                lVar11 = (long)(int)lVar11;
                v_00 = uVar14;
                do {
                  If_Dec10MoveTo(pF,nVars,uVar19,nVars + -1,(int *)local_878,(int *)local_8a8);
                  If_Dec10MoveTo(pF,nVars,uVar4,nVars + -2,(int *)local_878,(int *)local_8a8);
                  If_Dec10MoveTo(pF,nVars,v,nVars + -3,(int *)local_878,(int *)local_8a8);
                  If_Dec10MoveTo(pF,nVars,v_00,nVars + -4,(int *)local_878,(int *)local_8a8);
                  uVar6 = 0;
                  do {
                    if (uVar6 != local_878[(int)local_8a8[uVar6]]) {
                      __assert_fail("Pla2Var[Var2Pla[i]] == i",
                                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec10.c"
                                    ,0x17c,"void If_DecVerifyPerm(int *, int *, int)");
                    }
                    uVar6 = uVar6 + 1;
                  } while ((uint)nVars != uVar6);
                  local_748[0] = *pF & uVar5;
                  uVar23 = 1;
                  iVar10 = 1;
                  do {
                    bVar1 = bVar9 & 0x1f;
                    uVar6 = pF[(uint)(iVar10 << bVar1) >> 6] >> ((byte)(iVar10 << bVar1) & 0x3f) &
                            uVar5;
                    if ((int)uVar23 < 1) {
                      uVar12 = (ulong)(uint)(0 << bVar1);
                    }
                    else {
                      uVar7 = (ulong)(uint)(0 << bVar1);
                      do {
                        uVar12 = uVar7;
                        if (uVar6 == local_748[uVar7]) break;
                        uVar7 = uVar7 + 1;
                        uVar12 = (ulong)uVar23;
                      } while (uVar23 != uVar7);
                    }
                    if ((uint)uVar12 == uVar23) {
                      lVar8 = (long)(int)uVar23;
                      uVar23 = uVar23 + 1;
                      local_748[lVar8] = uVar6;
                    }
                    iVar10 = iVar10 + 1;
                  } while (iVar10 != 0x10);
                  local_6c8[lVar11] = uVar23;
                  local_378[lVar11] =
                       1 << ((byte)uVar19 & 0x1f) | 1 << (uVar4 & 0x1f) | 1 << (v & 0x1f) |
                       1 << (v_00 & 0x1f);
                  if ((int)uVar23 < 2) {
                    __assert_fail("Count[v] > 1",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec10.c"
                                  ,0x1a5,"int If_Dec10Perform(word *, int, int)");
                  }
                  if ((int)uVar23 < 6 && uVar23 != 2) {
                    iVar10 = 0;
                    do {
                      If_Dec10Cofactors(pF,nVars,(nVars + -1) - iVar10,local_7c8,local_848);
                      if (nVars < 7) {
                        __assert_fail("nVars > 6 && nVars <= 10",
                                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec10.c"
                                      ,0x9d,"int If_Dec10CofCount2(word *, int)");
                      }
                      uVar12 = local_7c8[0] & uVar20;
                      iVar15 = 1;
                      uVar6 = uVar12;
                      do {
                        uVar3 = iVar15 << (bVar9 & 0x1f);
                        uVar18 = local_7c8[uVar3 >> 6] >> ((byte)uVar3 & 0x3f) & uVar5;
                        uVar7 = uVar6;
                        if (((uVar18 != uVar12) && (uVar7 = uVar18, uVar6 != uVar12)) &&
                           (uVar7 = uVar6, uVar18 != uVar6)) goto LAB_00394394;
                        iVar15 = iVar15 + 1;
                        uVar6 = uVar7;
                      } while (iVar15 != 0x10);
                      uVar12 = local_848[0] & uVar20;
                      iVar15 = 1;
                      uVar6 = uVar12;
                      while (((uVar3 = iVar15 << (bVar9 & 0x1f),
                              uVar18 = local_848[uVar3 >> 6] >> ((byte)uVar3 & 0x3f) & uVar5,
                              uVar7 = uVar6, uVar18 == uVar12 || (uVar7 = uVar18, uVar6 == uVar12))
                             || (uVar7 = uVar6, uVar18 == uVar6))) {
                        iVar15 = iVar15 + 1;
                        uVar6 = uVar7;
                        if (iVar15 == 0x10) {
                          local_6c8[lVar11] = -uVar23;
                          goto LAB_003943ba;
                        }
                      }
LAB_00394394:
                      iVar10 = iVar10 + 1;
                    } while (iVar10 != 4);
                  }
LAB_003943ba:
                  v_00 = v_00 + 1;
                  lVar11 = lVar11 + 1;
                } while ((int)v_00 < nVars);
              }
              v = uVar14;
            } while ((int)uVar14 < nVars);
          }
          uVar4 = uVar16;
        } while (uVar16 != nVars);
      }
      uVar4 = (uint)lVar11;
      uVar19 = uVar2;
    } while (uVar2 != nVars);
  }
  if (0xd2 < (int)uVar4) {
    __assert_fail("v <= 210",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec10.c"
                  ,0x1b4,"int If_Dec10Perform(word *, int, int)");
  }
  if (0 < (int)uVar4) {
    uVar6 = (ulong)uVar4;
    puVar22 = local_6c8;
    puVar17 = local_378;
    uVar5 = uVar6;
    uVar20 = 0;
    do {
      uVar12 = uVar20 + 1;
      if (uVar12 < uVar6) {
        uVar7 = 1;
        do {
          uVar4 = puVar17[uVar7] & local_378[uVar20];
          if (0xfffe < (int)uVar4) {
            __assert_fail("Num16 < (1<<16)-1",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec10.c"
                          ,0x175,"int If_Dec10Count16(int)");
          }
          if (BitCount8[uVar4 >> 8 & 0xff] + BitCount8[uVar4 & 0xff] <= 10 - nVars) {
            if (nVars == 9) {
              if (local_6c8[uVar20] == 2) {
                if (puVar22[uVar7] == 2) {
                  return 1;
                }
                if ((int)puVar22[uVar7] < 0) {
                  return 1;
                }
              }
              if ((int)local_6c8[uVar20] < 0) {
LAB_003944e7:
                if (puVar22[uVar7] == 2) {
                  return 1;
                }
              }
            }
            else if (nVars == 10) {
              if (local_6c8[uVar20] == 2) goto LAB_003944e7;
            }
            else {
              uVar4 = local_6c8[uVar20];
              if (uVar4 == 2) {
                if (puVar22[uVar7] == 2) {
                  return 1;
                }
                if ((int)puVar22[uVar7] < 0) {
                  return 1;
                }
              }
              if ((int)uVar4 < 0) {
                if (puVar22[uVar7] == 2) {
                  return 1;
                }
                if (((int)uVar4 < 0) && ((int)puVar22[uVar7] < 0)) {
                  return 1;
                }
              }
            }
          }
          uVar7 = uVar7 + 1;
        } while (uVar5 != uVar7);
      }
      puVar22 = puVar22 + 1;
      puVar17 = puVar17 + 1;
      uVar5 = uVar5 - 1;
      uVar20 = uVar12;
    } while (uVar12 != uVar6);
  }
  return 0;
}

Assistant:

int If_Dec10Perform( word * pF, int nVars, int fDerive )
{ 
//    static int Cnt = 0;
    word pCof0[16], pCof1[16];
    int Pla2Var[10], Var2Pla[10], Count[210], Masks[210];
    int i, i0,i1,i2,i3, v, x;
    assert( nVars >= 6 && nVars <= 10 );
    // start arrays
    for ( i = 0; i < nVars; i++ )
    {
        assert( If_Dec10HasVar( pF, nVars, i ) );
        Pla2Var[i] = Var2Pla[i] = i;
    }
/*
    Cnt++;
//if ( Cnt == 108 )
{
printf( "%d\n", Cnt );
//Extra_PrintHex( stdout, (unsigned *)pF, nVars );
//printf( "\n" ); 
Kit_DsdPrintFromTruth( (unsigned *)pF, nVars );
printf( "\n" );
printf( "\n" );
}
*/
    // generate permutations
    v = 0;
    for ( i0 = 0;    i0 < nVars; i0++ )
    for ( i1 = i0+1; i1 < nVars; i1++ )
    for ( i2 = i1+1; i2 < nVars; i2++ )
    for ( i3 = i2+1; i3 < nVars; i3++, v++ )
    {
        If_Dec10MoveTo( pF, nVars, i0, nVars-1, Pla2Var, Var2Pla );
        If_Dec10MoveTo( pF, nVars, i1, nVars-2, Pla2Var, Var2Pla );
        If_Dec10MoveTo( pF, nVars, i2, nVars-3, Pla2Var, Var2Pla );
        If_Dec10MoveTo( pF, nVars, i3, nVars-4, Pla2Var, Var2Pla );
        If_DecVerifyPerm( Pla2Var, Var2Pla, nVars );
        Count[v] = If_Dec10CofCount( pF, nVars );
        Masks[v] = (1 << i0) | (1 << i1) | (1 << i2) | (1 << i3);
        assert( Count[v] > 1 );
//printf( "%d ", Count[v] );
        if ( Count[v] == 2 || Count[v] > 5 )
            continue;
        for ( x = 0; x < 4; x++ )
        {
            If_Dec10Cofactors( pF, nVars, nVars-1-x, pCof0, pCof1 );
            if ( If_Dec10CofCount2(pCof0, nVars) <= 2 && If_Dec10CofCount2(pCof1, nVars) <= 2 )
            {
                Count[v] = -Count[v];
                break;
            }
        }
    }
//printf( "\n" );
    assert( v <= 210 );
    // check if there are compatible bound sets
    for ( i0 = 0; i0 < v; i0++ )
    for ( i1 = i0+1; i1 < v; i1++ )
    {
        if ( If_Dec10Count16(Masks[i0] & Masks[i1]) > 10 - nVars )
            continue;
        if ( nVars == 10 )
        {
            if ( Count[i0] == 2 && Count[i1] == 2 )
                return 1;
        }
        else if ( nVars == 9 )
        {
            if ( (Count[i0] == 2 && Count[i1] == 2) || 
                 (Count[i0] == 2 && Count[i1] <  0) || 
                 (Count[i0] <  0 && Count[i1] == 2) )
                return 1;
        }
        else
        {
            if ( (Count[i0] == 2 && Count[i1] == 2) || 
                 (Count[i0] == 2 && Count[i1] <  0) || 
                 (Count[i0] <  0 && Count[i1] == 2) || 
                 (Count[i0] <  0 && Count[i1] <  0) )
                return 1;
        }
    }
//    printf( "not found\n" );
    return 0;
}